

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O3

void redirect_duplicated_labels
               (MIR_context_t ctx,VARR_MIR_insn_t *labels,VARR_MIR_insn_t *branch_insns)

{
  MIR_insn_t_conflict pMVar1;
  MIR_error_func_t p_Var2;
  MIR_func_t pMVar3;
  MIR_func_t func;
  long *name;
  int iVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  long lVar8;
  gen_ctx *pgVar9;
  VARR_MIR_var_t *pVVar10;
  reg_desc_t *prVar11;
  MIR_lref_data *pMVar12;
  undefined8 *puVar13;
  long lVar14;
  size_t sVar15;
  DLIST_MIR_insn_t DVar16;
  size_t sStack_40;
  
  if (labels != (VARR_MIR_insn_t *)0x0) {
LAB_001384ed:
    while (sVar15 = labels->els_num, sVar15 != 0) {
      if (labels->varr == (MIR_insn_t_conflict *)0x0) {
        redirect_duplicated_labels_cold_1();
        goto LAB_001385a8;
      }
      labels->els_num = sVar15 - 1;
      pMVar1 = labels->varr[sVar15 - 1];
      uVar7 = *(ulong *)&pMVar1->field_0x18;
      iVar4 = (int)uVar7;
      if (iVar4 == 0xaa) goto LAB_00138533;
      if (iVar4 != 0xa6) {
        if (iVar4 == 0xa5) {
          lVar14 = 1;
          uVar7 = 2;
        }
        else {
          uVar7 = 1;
          lVar14 = 0;
        }
        goto LAB_0013854e;
      }
    }
    if (ctx != (MIR_context_t)0x0) {
      pgVar9 = ctx->gen_ctx;
      if (pgVar9 != (gen_ctx *)0x0) {
        p_Var2 = ctx->error_func;
        do {
          pgVar9 = (gen_ctx *)((long)&pgVar9[-1].spot_attrs + 7);
          if (p_Var2 == (MIR_error_func_t)0x0) goto LAB_001385a8;
          ctx->gen_ctx = pgVar9;
          **(undefined8 **)(p_Var2 + (long)pgVar9 * 8) = 0;
        } while (pgVar9 != (gen_ctx *)0x0);
      }
      return;
    }
    goto LAB_001385b2;
  }
  goto LAB_001385ad;
LAB_00138533:
  if (uVar7 >> 0x21 != 0) {
    uVar7 = uVar7 >> 0x20;
    lVar14 = 1;
LAB_0013854e:
    lVar8 = uVar7 - lVar14;
    puVar13 = (undefined8 *)((long)&pMVar1->ops[0].u + (ulong)(uint)((int)lVar14 * 0x30));
    do {
      *puVar13 = *(undefined8 *)*puVar13;
      puVar13 = puVar13 + 6;
      lVar8 = lVar8 + -1;
    } while (lVar8 != 0);
  }
  goto LAB_001384ed;
LAB_001385a8:
  redirect_duplicated_labels_cold_2();
LAB_001385ad:
  redirect_duplicated_labels_cold_4();
LAB_001385b2:
  redirect_duplicated_labels_cold_3();
  if (((MIR_item_t_conflict)labels == (MIR_item_t_conflict)0x0) ||
     (((MIR_item_t_conflict)labels)->item_type != MIR_func_item)) {
LAB_0013875b:
    __assert_fail("func_item != ((void*)0) && func_item->item_type == MIR_func_item",
                  "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                  ,0xac9,"void _MIR_restore_func_insns(MIR_context_t, MIR_item_t)");
  }
  pMVar3 = (((MIR_item_t_conflict)labels)->u).func;
  pVVar10 = pMVar3->vars;
  if (pVVar10 != (VARR_MIR_var_t *)0x0) {
    do {
      uVar7 = pVVar10->els_num;
      if (uVar7 <= pMVar3->original_vars_num) goto LAB_001386a1;
      func = (MIR_func_t)pVVar10->varr;
      if (func == (MIR_func_t)0x0) {
LAB_00138756:
        _MIR_restore_func_insns_cold_2();
        goto LAB_0013875b;
      }
      pVVar10->els_num = uVar7 - 1;
      name = (long *)pMVar3->internal;
      prVar11 = find_rd_by_name(*(MIR_context_t *)((long)func + uVar7 * 0x18 + -0x10),(char *)name,
                                func);
      if (prVar11 == (reg_desc_t *)0x0) {
        __assert_fail("rd != ((void*)0)",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                      ,0xad3,"void _MIR_restore_func_insns(MIR_context_t, MIR_item_t)");
      }
      if (*name == 0) {
        _MIR_restore_func_insns_cold_1();
        goto LAB_00138756;
      }
      sVar15 = ((long)prVar11 - *(long *)(*name + 0x10) >> 3) * -0x5555555555555555;
      uVar5 = HTAB_size_t_do((HTAB_size_t *)name[1],sVar15,HTAB_DELETE,&sStack_40);
      uVar6 = HTAB_size_t_do((HTAB_size_t *)name[3],sVar15,HTAB_DELETE,&sStack_40);
      if ((uVar6 & uVar5) == 0) {
        __assert_fail("res_p",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/mir/mir.c"
                      ,0xad7,"void _MIR_restore_func_insns(MIR_context_t, MIR_item_t)");
      }
      pVVar10 = pMVar3->vars;
    } while (pVVar10 != (VARR_MIR_var_t *)0x0);
  }
  _MIR_restore_func_insns_cold_3();
LAB_001386a1:
  pMVar1 = (pMVar3->insns).head;
  while (pMVar1 != (MIR_insn_t_conflict)0x0) {
    remove_insn(ctx,(MIR_item_t_conflict)labels,pMVar1,
                &((((MIR_item_t_conflict)labels)->u).func)->insns);
    pMVar1 = (pMVar3->insns).head;
  }
  pMVar1 = (pMVar3->original_insns).tail;
  (pMVar3->insns).head = (pMVar3->original_insns).head;
  (pMVar3->insns).tail = pMVar1;
  DVar16 = (DLIST_MIR_insn_t)(ZEXT816(0) << 0x20);
  pMVar3->original_insns = DVar16;
  for (pMVar12 = pMVar3->first_lref; pMVar12 != (MIR_lref_data *)0x0; pMVar12 = pMVar12->next) {
    pMVar12->label = pMVar12->orig_label;
    pMVar12->label2 = pMVar12->orig_label2;
    pMVar12->orig_label = DVar16.head;
    pMVar12->orig_label2 = DVar16.tail;
  }
  return;
}

Assistant:

static void redirect_duplicated_labels (MIR_context_t ctx MIR_UNUSED, VARR (MIR_insn_t) * labels,
                                        VARR (MIR_insn_t) * branch_insns) {
  MIR_insn_t insn;

  while (VARR_LENGTH (MIR_insn_t, branch_insns) != 0) { /* redirect new label operands */
    size_t start_label_nop = 0, bound_label_nop = 1, n;

    insn = VARR_POP (MIR_insn_t, branch_insns);
    if (insn->code == MIR_JMPI) continue;
    if (insn->code == MIR_SWITCH) {
      start_label_nop = 1;
      bound_label_nop = start_label_nop + insn->nops - 1;
    } else if (insn->code == MIR_LADDR) {
      start_label_nop = 1;
      bound_label_nop = 2;
    }
    for (n = start_label_nop; n < bound_label_nop; n++)
      insn->ops[n].u.label = insn->ops[n].u.label->data;
  }
  while (VARR_LENGTH (MIR_insn_t, labels) != 0) { /* reset data */
    insn = VARR_POP (MIR_insn_t, labels);
    insn->data = NULL;
  }
}